

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastShiftRightInt
               (Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
               Vec_Int_t *vRes)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  bool bVar10;
  int local_70;
  
  piVar3 = Wlc_VecCopy(vRes,pNum,nNum);
  if (fSticky == 0) {
    local_70 = 0;
  }
  else {
    local_70 = pNum[(long)nNum + -1];
  }
  if (nShift < 0x21) {
    uVar6 = 0;
    uVar4 = (ulong)(uint)(nNum - fSticky);
    if (nNum - fSticky < 1) {
      uVar4 = uVar6;
    }
    if (nShift < 1) {
      nShift = 0;
    }
    bVar1 = false;
    for (; uVar6 != (uint)nShift; uVar6 = uVar6 + 1) {
      iVar5 = 1 << ((byte)uVar6 & 0x1f);
      lVar7 = (long)iVar5;
      piVar8 = piVar3;
      uVar9 = uVar4;
      while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
        if ((bVar1) || (nNum <= lVar7)) {
          iVar2 = Gia_ManHashMux(pNew,pShift[uVar6],local_70,*piVar8);
          *piVar8 = iVar2;
          if (nNum < iVar5) {
            bVar1 = true;
          }
        }
        else {
          iVar2 = Gia_ManHashMux(pNew,pShift[uVar6],piVar8[iVar5],*piVar8);
          *piVar8 = iVar2;
          bVar1 = false;
        }
        piVar8 = piVar8 + 1;
        lVar7 = lVar7 + 1;
      }
    }
    return;
  }
  __assert_fail("nShift <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                ,0x81,
                "void Wlc_BlastShiftRightInt(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)"
               );
}

Assistant:

void Wlc_BlastShiftRightInt( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int * pRes = Wlc_VecCopy( vRes, pNum, nNum );
    int Fill = fSticky ? pNum[nNum-1] : 0;
    int i, j, fShort = 0;
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++ ) 
        for( j = 0; j < nNum - fSticky; j++ ) 
        {
            if( fShort || j + (1<<i) >= nNum ) 
            {
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], Fill, pRes[j] );
                if ( (1<<i) > nNum ) 
                    fShort = 1;
            } 
            else 
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], pRes[j+(1<<i)], pRes[j] );
        }
}